

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O0

void re2::MultithreadedSearchDFA(void)

{
  Regexp *pRVar1;
  SearchThread *pSVar2;
  Prog *pPVar3;
  ostream *poVar4;
  reference ppSVar5;
  int local_5a8;
  int local_5a4;
  int j_2;
  int j_1;
  StringPiece local_590;
  SearchThread *local_580;
  SearchThread *t_1;
  undefined1 local_570 [4];
  int j;
  vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> threads;
  Prog *prog_1;
  undefined1 local_3c8 [4];
  int i;
  StringPiece local_3b8;
  SearchThread *local_3a8;
  SearchThread *t;
  Prog *local_220;
  Prog *prog;
  string match;
  re2 local_1f8 [8];
  string no_match;
  LogMessage local_1d8;
  string local_48 [32];
  StringPiece local_28;
  Regexp *local_18;
  Regexp *re;
  int n;
  
  re._4_4_ = 0x12;
  StringPrintf_abi_cxx11_((char *)local_48,"0[01]{%d}$",0x12);
  StringPiece::StringPiece(&local_28,local_48);
  pRVar1 = Regexp::Parse(&local_28,LikePerl,(RegexpStatus *)0x0);
  std::__cxx11::string::~string((string *)local_48);
  local_18 = pRVar1;
  if (pRVar1 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x110);
    poVar4 = LogMessage::stream(&local_1d8);
    std::operator<<(poVar4,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  DeBruijnString_abi_cxx11_(local_1f8,0x12);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prog,
                 (char *)local_1f8);
  FLAGS_re2_dfa_bail_when_slow = 0;
  local_220 = Regexp::CompileToProg(local_18,0x40000);
  if (local_220 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&t,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x118);
    poVar4 = LogMessage::stream((LogMessage *)&t);
    std::operator<<(poVar4,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&t);
  }
  pSVar2 = (SearchThread *)operator_new(0x40);
  pPVar3 = local_220;
  StringPiece::StringPiece(&local_3b8,(string *)&prog);
  StringPiece::StringPiece((StringPiece *)local_3c8,(string *)local_1f8);
  SearchThread::SearchThread(pSVar2,pPVar3,&local_3b8,(StringPiece *)local_3c8);
  local_3a8 = pSVar2;
  Thread::SetJoinable((Thread *)pSVar2,true);
  Thread::Start(&local_3a8->super_Thread);
  Thread::Join(&local_3a8->super_Thread);
  if (local_3a8 != (SearchThread *)0x0) {
    (*(local_3a8->super_Thread)._vptr_Thread[1])();
  }
  pPVar3 = local_220;
  if (local_220 != (Prog *)0x0) {
    Prog::~Prog(local_220);
    operator_delete(pPVar3);
  }
  for (prog_1._4_4_ = 0; prog_1._4_4_ < FLAGS_repeat; prog_1._4_4_ = prog_1._4_4_ + 1) {
    pPVar3 = Regexp::CompileToProg(local_18,0x40000);
    if (pPVar3 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)
                 &threads.
                  super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0x126);
      poVar4 = LogMessage::stream((LogMessage *)
                                  &threads.
                                   super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar4,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)
                 &threads.
                  super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::vector
              ((vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)local_570);
    for (t_1._4_4_ = 0; t_1._4_4_ < FLAGS_threads; t_1._4_4_ = t_1._4_4_ + 1) {
      pSVar2 = (SearchThread *)operator_new(0x40);
      StringPiece::StringPiece(&local_590,(string *)&prog);
      StringPiece::StringPiece((StringPiece *)&j_2,(string *)local_1f8);
      SearchThread::SearchThread(pSVar2,pPVar3,&local_590,(StringPiece *)&j_2);
      local_580 = pSVar2;
      Thread::SetJoinable((Thread *)pSVar2,true);
      std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::push_back
                ((vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)local_570,
                 &local_580);
    }
    for (local_5a4 = 0; local_5a4 < FLAGS_threads; local_5a4 = local_5a4 + 1) {
      ppSVar5 = std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::operator[]
                          ((vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)
                           local_570,(long)local_5a4);
      Thread::Start(&(*ppSVar5)->super_Thread);
    }
    for (local_5a8 = 0; local_5a8 < FLAGS_threads; local_5a8 = local_5a8 + 1) {
      ppSVar5 = std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::operator[]
                          ((vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)
                           local_570,(long)local_5a8);
      Thread::Join(&(*ppSVar5)->super_Thread);
      ppSVar5 = std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::operator[]
                          ((vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)
                           local_570,(long)local_5a8);
      if (*ppSVar5 != (value_type)0x0) {
        (*((*ppSVar5)->super_Thread)._vptr_Thread[1])();
      }
    }
    if (pPVar3 != (Prog *)0x0) {
      Prog::~Prog(pPVar3);
      operator_delete(pPVar3);
    }
    std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::~vector
              ((vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)local_570);
  }
  Regexp::Decref(local_18);
  std::__cxx11::string::~string((string *)&prog);
  std::__cxx11::string::~string((string *)local_1f8);
  return;
}

Assistant:

TEST(Multithreaded, SearchDFA) {
  // Same as single-threaded test above.
  const int n = 18;
  Regexp* re = Regexp::Parse(StringPrintf("0[01]{%d}$", n),
                             Regexp::LikePerl, NULL);
  CHECK(re);
  string no_match = DeBruijnString(n);
  string match = no_match + "0";
  FLAGS_re2_dfa_bail_when_slow = false;

  // Check that single-threaded code works.
  {
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);
    SearchThread* t = new SearchThread(prog, match, no_match);
    t->SetJoinable(true);
    t->Start();
    t->Join();
    delete t;
    delete prog;
  }

  // Run the search simultaneously in a bunch of threads.
  // Reuse same flags for Multithreaded.BuildDFA above.
  for (int i = 0; i < FLAGS_repeat; i++) {
    //LOG(INFO) << "Search " << i;
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);

    vector<SearchThread*> threads;
    for (int j = 0; j < FLAGS_threads; j++) {
      SearchThread *t = new SearchThread(prog, match, no_match);
      t->SetJoinable(true);
      threads.push_back(t);
    }
    for (int j = 0; j < FLAGS_threads; j++)
      threads[j]->Start();
    for (int j = 0; j < FLAGS_threads; j++) {
      threads[j]->Join();
      delete threads[j];
    }
    delete prog;
  }
  re->Decref();
}